

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementText.cpp
# Opt level: O0

void Rml::LogMissingFontFace(Element *element)

{
  FontStyle style;
  FontWeight weight;
  ulong uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  String local_d0;
  undefined1 local_b0 [8];
  String font_face_description;
  ComputedValues *computed;
  allocator<char> local_51;
  String local_50;
  undefined1 local_30 [8];
  String font_family_property;
  Element *element_local;
  
  font_family_property.field_2._8_8_ = element;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"font-family",&local_51);
  Element::GetProperty<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,element,
             &local_50);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::allocator<char>::~allocator(&local_51);
  uVar1 = ::std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    font_face_description.field_2._8_8_ =
         (size_type)Element::GetComputedValues(font_family_property.field_2._8_8_);
    style = Style::ComputedValues::font_style((ComputedValues *)font_face_description.field_2._8_8_)
    ;
    weight = Style::ComputedValues::font_weight
                       ((ComputedValues *)font_face_description.field_2._8_8_);
    GetFontFaceDescription((String *)local_b0,(String *)local_30,style,weight);
    uVar2 = ::std::__cxx11::string::c_str();
    Element::GetAddress_abi_cxx11_
              (&local_d0,(Element *)font_family_property.field_2._8_8_,false,true);
    uVar3 = ::std::__cxx11::string::c_str();
    Log::Message(LT_WARNING,
                 "No font face defined. Ensure (1) that Context::Update is run after new elements are constructed, before Context::Render, and (2) that the specified font face %s has been successfully loaded. Please see previous log messages for all successfully loaded fonts. On element %s"
                 ,uVar2,uVar3);
    ::std::__cxx11::string::~string((string *)&local_d0);
    ::std::__cxx11::string::~string((string *)local_b0);
  }
  else {
    Element::GetAddress_abi_cxx11_
              ((String *)&computed,(Element *)font_family_property.field_2._8_8_,false,true);
    uVar2 = ::std::__cxx11::string::c_str();
    Log::Message(LT_WARNING,"No font face defined. Missing \'font-family\' property. On element %s",
                 uVar2);
    ::std::__cxx11::string::~string((string *)&computed);
  }
  ::std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void LogMissingFontFace(Element* element)
{
	const String font_family_property = element->GetProperty<String>("font-family");
	if (font_family_property.empty())
	{
		Log::Message(Log::LT_WARNING, "No font face defined. Missing 'font-family' property. On element %s", element->GetAddress().c_str());
	}
	else
	{
		const ComputedValues& computed = element->GetComputedValues();
		const String font_face_description = GetFontFaceDescription(font_family_property, computed.font_style(), computed.font_weight());
		Log::Message(Log::LT_WARNING,
			"No font face defined. Ensure (1) that Context::Update is run after new elements are constructed, before Context::Render, "
			"and (2) that the specified font face %s has been successfully loaded. "
			"Please see previous log messages for all successfully loaded fonts. On element %s",
			font_face_description.c_str(), element->GetAddress().c_str());
	}
}